

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          EnumValueDescriptor *value)

{
  undefined4 uVar1;
  int iVar2;
  LogMessage *pLVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedEnum",CPPTYPE_ENUM);
  }
  if (*(long *)(value + 0x18) != *(long *)(field + 0x50)) {
    anon_unknown_0::ReportReflectionUsageEnumTypeError
              (this->descriptor_,field,"SetRepeatedEnum",value);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar2 = this->extensions_offset_;
    if (iVar2 == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,pLVar3);
      LogMessage::~LogMessage(&local_68);
      iVar2 = this->extensions_offset_;
    }
    ExtensionSet::SetRepeatedEnum
              ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar2)
               ,*(int *)(field + 0x28),index,*(int *)(value + 0x10));
  }
  else {
    uVar1 = *(undefined4 *)(value + 0x10);
    iVar2 = this->offsets_
            [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
             -0x11111111];
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + (long)iVar2) <= index) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                 ,0x271);
      pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
      LogFinisher::operator=(&local_69,pLVar3);
      LogMessage::~LogMessage(&local_68);
    }
    *(undefined4 *)
     (*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar2) +
     (long)index * 4) = uVar1;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedEnum(
    Message* message,
    const FieldDescriptor* field, int index,
    const EnumValueDescriptor* value) const {
  USAGE_CHECK_ALL(SetRepeatedEnum, REPEATED, ENUM);
  USAGE_CHECK_ENUM_VALUE(SetRepeatedEnum);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedEnum(
      field->number(), index, value->number());
  } else {
    SetRepeatedField<int>(message, field, index, value->number());
  }
}